

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

int __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::vSolveUpdateRight(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *vec,int *ridx,int n,
                   number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *eps)

{
  uint *puVar1;
  int iVar2;
  fpclass_type fVar3;
  int32_t iVar4;
  undefined8 uVar5;
  cpp_dec_float<100U,_int,_void> *pcVar6;
  cpp_dec_float<100U,_int,_void> *pcVar7;
  cpp_dec_float<100U,_int,_void> *pcVar8;
  cpp_dec_float<100U,_int,_void> *pcVar9;
  bool bVar10;
  type_conflict5 tVar11;
  type_conflict5 tVar12;
  int iVar13;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar14;
  int *piVar15;
  long lVar16;
  int *piVar17;
  long lVar18;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<100U,_int,_void> *local_270;
  cpp_dec_float<100U,_int,_void> local_268;
  cpp_dec_float<100U,_int,_void> local_218;
  long local_1c8;
  int *local_1c0;
  int *local_1b8;
  int *local_1b0;
  pointer local_1a8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1a0;
  long local_198;
  int *local_190;
  long local_188;
  int *local_180;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_178;
  cpp_dec_float<100U,_int,_void> local_128;
  cpp_dec_float<100U,_int,_void> local_d8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_88;
  
  local_218.fpclass = cpp_dec_float_finite;
  local_218.prec_elem = 0x10;
  local_218.data._M_elems[0] = 0;
  local_218.data._M_elems[1] = 0;
  local_218.data._M_elems[2] = 0;
  local_218.data._M_elems[3] = 0;
  local_218.data._M_elems[4] = 0;
  local_218.data._M_elems[5] = 0;
  local_218.data._M_elems[6] = 0;
  local_218.data._M_elems[7] = 0;
  local_218.data._M_elems[0xc] = 0;
  local_218.data._M_elems[0xd] = 0;
  local_218.data._M_elems._56_5_ = 0;
  local_218.data._M_elems[0xf]._1_3_ = 0;
  local_218.exp = 0;
  local_218.neg = false;
  local_218.data._M_elems[8] = 0;
  local_218.data._M_elems[9] = 0;
  local_218.data._M_elems[10] = 0;
  local_218.data._M_elems[0xb] = 0;
  local_1a8 = (this->l).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_1b0 = (this->l).idx;
  piVar17 = (this->l).row;
  local_1c0 = (this->l).start;
  lVar18 = (long)(this->l).firstUnused;
  local_1c8 = lVar18;
  local_1b8 = piVar17;
  local_1a0 = eps;
  local_190 = ridx;
  for (lVar16 = (long)(this->l).firstUpdate; lVar16 < lVar18; lVar16 = lVar16 + 1) {
    iVar13 = piVar17[lVar16];
    local_128.data._M_elems._0_8_ = *(undefined8 *)vec[iVar13].m_backend.data._M_elems;
    local_128.data._M_elems._8_8_ = *(undefined8 *)(vec[iVar13].m_backend.data._M_elems + 2);
    puVar1 = vec[iVar13].m_backend.data._M_elems + 4;
    local_128.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    local_128.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
    puVar1 = vec[iVar13].m_backend.data._M_elems + 8;
    local_128.data._M_elems._32_8_ = *(undefined8 *)puVar1;
    local_128.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
    puVar1 = vec[iVar13].m_backend.data._M_elems + 0xc;
    local_128.data._M_elems._48_8_ = *(undefined8 *)puVar1;
    local_128.data._M_elems._56_8_ = *(undefined8 *)(puVar1 + 2);
    local_178.m_backend.exp = vec[iVar13].m_backend.exp;
    local_178.m_backend.neg = vec[iVar13].m_backend.neg;
    local_178.m_backend.fpclass = vec[iVar13].m_backend.fpclass;
    local_178.m_backend.prec_elem = vec[iVar13].m_backend.prec_elem;
    local_178.m_backend.data._M_elems._0_8_ = *(undefined8 *)vec[iVar13].m_backend.data._M_elems;
    local_178.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)(vec[iVar13].m_backend.data._M_elems + 2);
    puVar1 = vec[iVar13].m_backend.data._M_elems + 4;
    local_178.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    local_178.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
    puVar1 = vec[iVar13].m_backend.data._M_elems + 8;
    local_178.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar1;
    local_178.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
    puVar1 = vec[iVar13].m_backend.data._M_elems + 0xc;
    local_178.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar1;
    local_178.m_backend.data._M_elems._56_8_ = *(undefined8 *)(puVar1 + 2);
    local_88.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
    local_88.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
    local_88.m_backend.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
    local_88.m_backend.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
    local_88.m_backend.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
    local_88.m_backend.data._M_elems._40_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 10);
    local_88.m_backend.data._M_elems._48_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 0xc);
    local_88.m_backend.data._M_elems._56_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 0xe);
    local_88.m_backend.exp = (eps->m_backend).exp;
    local_88.m_backend.neg = (eps->m_backend).neg;
    local_88.m_backend.fpclass = (eps->m_backend).fpclass;
    local_88.m_backend.prec_elem = (eps->m_backend).prec_elem;
    local_128.exp = local_178.m_backend.exp;
    local_128.neg = local_178.m_backend.neg;
    local_128.fpclass = local_178.m_backend.fpclass;
    local_128.prec_elem = local_178.m_backend.prec_elem;
    bVar10 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                       (&local_178,&local_88);
    if (bVar10) {
      local_188 = (long)local_1c0[lVar16];
      piVar15 = local_1b0 + local_188;
      local_270 = &local_1a8[local_188].m_backend;
      iVar13 = local_1c0[lVar16 + 1];
      local_198 = lVar16;
      while( true ) {
        eps = local_1a0;
        lVar16 = local_198;
        piVar17 = local_1b8;
        lVar18 = local_1c8;
        if (iVar13 <= (int)local_188) break;
        iVar2 = *piVar15;
        local_190[n] = iVar2;
        local_218.data._M_elems._0_8_ = *(undefined8 *)vec[iVar2].m_backend.data._M_elems;
        local_218.data._M_elems._8_8_ = *(undefined8 *)(vec[iVar2].m_backend.data._M_elems + 2);
        puVar1 = vec[iVar2].m_backend.data._M_elems + 4;
        local_218.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        local_218.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = vec[iVar2].m_backend.data._M_elems + 8;
        local_218.data._M_elems._32_8_ = *(undefined8 *)puVar1;
        local_218.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = vec[iVar2].m_backend.data._M_elems + 0xc;
        local_218.data._M_elems._48_8_ = *(undefined8 *)puVar1;
        uVar5 = *(undefined8 *)(puVar1 + 2);
        local_218.data._M_elems._56_5_ = SUB85(uVar5,0);
        local_218.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
        local_218.exp = vec[iVar2].m_backend.exp;
        local_218.neg = vec[iVar2].m_backend.neg;
        local_218.fpclass = vec[iVar2].m_backend.fpclass;
        local_218.prec_elem = vec[iVar2].m_backend.prec_elem;
        local_268.data._M_elems._0_8_ = local_268.data._M_elems._0_8_ & 0xffffffff00000000;
        local_180 = piVar15;
        tVar11 = boost::multiprecision::operator==
                           ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_218,(int *)&local_268);
        local_d8.fpclass = cpp_dec_float_finite;
        local_d8.prec_elem = 0x10;
        local_d8.data._M_elems[0] = 0;
        local_d8.data._M_elems[1] = 0;
        local_d8.data._M_elems[2] = 0;
        local_d8.data._M_elems[3] = 0;
        local_d8.data._M_elems[4] = 0;
        local_d8.data._M_elems[5] = 0;
        local_d8.data._M_elems[6] = 0;
        local_d8.data._M_elems[7] = 0;
        local_d8.data._M_elems[8] = 0;
        local_d8.data._M_elems[9] = 0;
        local_d8.data._M_elems[10] = 0;
        local_d8.data._M_elems[0xb] = 0;
        local_d8.data._M_elems[0xc] = 0;
        local_d8.data._M_elems[0xd] = 0;
        local_d8.data._M_elems._56_5_ = 0;
        local_d8.data._M_elems[0xf]._1_3_ = 0;
        local_d8.exp = 0;
        local_d8.neg = false;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                  (&local_d8,&local_128,local_270);
        local_268.fpclass = cpp_dec_float_finite;
        local_268.prec_elem = 0x10;
        local_268.data._M_elems[0] = 0;
        local_268.data._M_elems[1] = 0;
        local_268.data._M_elems[2] = 0;
        local_268.data._M_elems[3] = 0;
        local_268.data._M_elems[4] = 0;
        local_268.data._M_elems[5] = 0;
        local_268.data._M_elems[6] = 0;
        local_268.data._M_elems[7] = 0;
        local_268.data._M_elems[8] = 0;
        local_268.data._M_elems[9] = 0;
        local_268.data._M_elems[10] = 0;
        local_268.data._M_elems[0xb] = 0;
        local_268.data._M_elems[0xc] = 0;
        local_268.data._M_elems[0xd] = 0;
        local_268.data._M_elems._56_5_ = 0;
        local_268.data._M_elems[0xf]._1_3_ = 0;
        local_268.exp = 0;
        local_268.neg = false;
        boost::multiprecision::default_ops::
        eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                  (&local_268,&local_218,&local_d8);
        local_218.data._M_elems[0xc] = local_268.data._M_elems[0xc];
        local_218.data._M_elems[0xd] = local_268.data._M_elems[0xd];
        local_218.data._M_elems._56_5_ = local_268.data._M_elems._56_5_;
        local_218.data._M_elems[0xf]._1_3_ = local_268.data._M_elems[0xf]._1_3_;
        local_218.data._M_elems[8] = local_268.data._M_elems[8];
        local_218.data._M_elems[9] = local_268.data._M_elems[9];
        local_218.data._M_elems[10] = local_268.data._M_elems[10];
        local_218.data._M_elems[0xb] = local_268.data._M_elems[0xb];
        local_218.data._M_elems[4] = local_268.data._M_elems[4];
        local_218.data._M_elems[5] = local_268.data._M_elems[5];
        local_218.data._M_elems[6] = local_268.data._M_elems[6];
        local_218.data._M_elems[7] = local_268.data._M_elems[7];
        local_218.data._M_elems[0] = local_268.data._M_elems[0];
        local_218.data._M_elems[1] = local_268.data._M_elems[1];
        local_218.data._M_elems[2] = local_268.data._M_elems[2];
        local_218.data._M_elems[3] = local_268.data._M_elems[3];
        local_218.exp = local_268.exp;
        local_218.neg = local_268.neg;
        local_218.fpclass = local_268.fpclass;
        local_218.prec_elem = local_268.prec_elem;
        local_d8.data._M_elems._0_8_ = local_d8.data._M_elems._0_8_ & 0xffffffff00000000;
        tVar12 = boost::multiprecision::operator!=
                           ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_218,(int *)&local_d8);
        if (tVar12) {
          local_268.data._M_elems[0xc] = local_218.data._M_elems[0xc];
          local_268.data._M_elems[0xd] = local_218.data._M_elems[0xd];
          local_268.data._M_elems._56_5_ = local_218.data._M_elems._56_5_;
          local_268.data._M_elems[0xf]._1_3_ = local_218.data._M_elems[0xf]._1_3_;
          local_268.data._M_elems[8] = local_218.data._M_elems[8];
          local_268.data._M_elems[9] = local_218.data._M_elems[9];
          local_268.data._M_elems[10] = local_218.data._M_elems[10];
          local_268.data._M_elems[0xb] = local_218.data._M_elems[0xb];
          local_268.data._M_elems[4] = local_218.data._M_elems[4];
          local_268.data._M_elems[5] = local_218.data._M_elems[5];
          local_268.data._M_elems[6] = local_218.data._M_elems[6];
          local_268.data._M_elems[7] = local_218.data._M_elems[7];
          local_268.data._M_elems[0] = local_218.data._M_elems[0];
          local_268.data._M_elems[1] = local_218.data._M_elems[1];
          local_268.data._M_elems[2] = local_218.data._M_elems[2];
          local_268.data._M_elems[3] = local_218.data._M_elems[3];
          pcVar6 = &local_218;
          pcVar7 = &local_218;
          pcVar8 = &local_218;
          pcVar9 = &local_218;
        }
        else {
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                    (&local_268,1e-100,(type *)0x0);
          pcVar6 = &local_268;
          pcVar7 = &local_268;
          pcVar8 = &local_268;
          pcVar9 = &local_268;
        }
        piVar15 = local_180 + 1;
        pnVar14 = vec + iVar2;
        n = n + (uint)tVar11;
        local_270 = local_270 + 1;
        iVar2 = pcVar6->exp;
        bVar10 = pcVar7->neg;
        fVar3 = pcVar8->fpclass;
        iVar4 = pcVar9->prec_elem;
        *(undefined8 *)((pnVar14->m_backend).data._M_elems + 0xc) = local_268.data._M_elems._48_8_;
        *(ulong *)((pnVar14->m_backend).data._M_elems + 0xe) =
             CONCAT35(local_268.data._M_elems[0xf]._1_3_,local_268.data._M_elems._56_5_);
        *(undefined8 *)((pnVar14->m_backend).data._M_elems + 8) = local_268.data._M_elems._32_8_;
        *(undefined8 *)((pnVar14->m_backend).data._M_elems + 10) = local_268.data._M_elems._40_8_;
        *(undefined8 *)((pnVar14->m_backend).data._M_elems + 4) = local_268.data._M_elems._16_8_;
        *(undefined8 *)((pnVar14->m_backend).data._M_elems + 6) = local_268.data._M_elems._24_8_;
        *(undefined8 *)(pnVar14->m_backend).data._M_elems = local_268.data._M_elems._0_8_;
        *(undefined8 *)((pnVar14->m_backend).data._M_elems + 2) = local_268.data._M_elems._8_8_;
        (pnVar14->m_backend).exp = iVar2;
        (pnVar14->m_backend).neg = bVar10;
        (pnVar14->m_backend).fpclass = fVar3;
        (pnVar14->m_backend).prec_elem = iVar4;
        iVar13 = iVar13 + -1;
      }
    }
  }
  return n;
}

Assistant:

int CLUFactor<R>::vSolveUpdateRight(R* vec, int* ridx, int n, R eps)
{
   int i, j, k;
   int end;
   R x, y;
   R* lval, *val;
   int* lrow, *lidx, *idx;
   int* lbeg;

   assert(!l.updateType);               /* no Forest-Tomlin Updates */

   lval = l.val.data();
   lidx = l.idx;
   lrow = l.row;
   lbeg = l.start;
   end = l.firstUnused;

   for(i = l.firstUpdate; i < end; ++i)
   {
      assert(i >= 0 && i < thedim);
      x = vec[lrow[i]];

      if(isNotZero(x, eps))
      {
         k = lbeg[i];
         assert(k >= 0 && k < l.size);
         idx = &(lidx[k]);
         val = &(lval[k]);

         for(j = lbeg[i + 1]; j > k; --j)
         {
            int m = ridx[n] = *idx++;
            assert(m >= 0 && m < thedim);
            y = vec[m];
            n += (y == 0) ? 1 : 0;
            y = y - x * (*val++);
            vec[m] = (y != 0) ? y : SOPLEX_FACTOR_MARKER;
         }
      }
   }

   return n;
}